

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateEnumDefinitions
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  Descriptor *pDVar1;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *this_02;
  EnumGenerator *this_03;
  int i;
  long lVar2;
  
  for (lVar2 = 0; pDVar1 = this->descriptor_, lVar2 < *(int *)(pDVar1 + 0x38); lVar2 = lVar2 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator[](&this->nested_generators_,lVar2);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                        (this_00);
    GenerateEnumDefinitions(this_01,printer);
  }
  for (lVar2 = 0; lVar2 < *(int *)(pDVar1 + 0x48); lVar2 = lVar2 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
              ::operator[](&this->enum_generators_,lVar2);
    this_03 = internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::operator->
                        (this_02);
    EnumGenerator::GenerateDefinition(this_03,printer);
    pDVar1 = this->descriptor_;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateEnumDefinitions(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateEnumDefinitions(printer);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateDefinition(printer);
  }
}